

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Scanner::scanStreamStart(Scanner *this)

{
  byte bVar1;
  byte *pbVar2;
  ilist_node_base<false> *piVar3;
  ilist_node_base<false> *piVar4;
  ulong uVar5;
  ilist_node_base<false> *piVar6;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined1 local_38 [16];
  
  this->IsStartOfStream = false;
  pbVar2 = (byte *)this->Current;
  uVar5 = (long)this->End - (long)pbVar2;
  if ((byte *)this->End != pbVar2) {
    bVar1 = *pbVar2;
    piVar6 = (ilist_node_base<false> *)0x0;
    if (bVar1 < 0xfe) {
      if (bVar1 == 0) {
        if ((((3 < uVar5) && (pbVar2[1] == 0)) && (pbVar2[2] != 0)) &&
           ((pbVar2[2] == 0xfe && (pbVar2[3] == 0xff)))) {
LAB_00da56a6:
          piVar6 = (ilist_node_base<false> *)0x4;
          goto LAB_00da56e3;
        }
      }
      else if ((bVar1 != 0xef) ||
              (((2 < uVar5 && (pbVar2[1] == 0xbb)) &&
               (piVar6 = (ilist_node_base<false> *)0x3, pbVar2[2] == 0xbf)))) goto LAB_00da56e3;
    }
    else if (bVar1 == 0xfe) {
      if ((uVar5 != 1) && (pbVar2[1] == 0xff)) {
LAB_00da56ba:
        piVar6 = (ilist_node_base<false> *)0x2;
        goto LAB_00da56e3;
      }
    }
    else {
      if (bVar1 != 0xff) goto LAB_00da56e3;
      if (uVar5 < 4) {
        if ((uVar5 != 1) && (piVar6 = (ilist_node_base<false> *)0x2, pbVar2[1] == 0xfe))
        goto LAB_00da56e3;
      }
      else if (pbVar2[1] == 0xfe) {
        if ((pbVar2[2] == 0) && (pbVar2[3] == 0)) goto LAB_00da56a6;
        goto LAB_00da56ba;
      }
    }
  }
  piVar6 = (ilist_node_base<false> *)0x0;
LAB_00da56e3:
  local_38[0] = 0;
  piVar4 = (ilist_node_base<false> *)
           BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                     (&(this->TokenQueue).
                       super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,0x48,
                      (Align)0x4);
  piVar4->Prev = (ilist_node_base<false> *)0x0;
  piVar4->Next = (ilist_node_base<false> *)0x0;
  uStack_58 = SUB84(pbVar2,0);
  uStack_54 = (undefined4)((ulong)pbVar2 >> 0x20);
  *(undefined4 *)&piVar4[1].Prev = 1;
  *(undefined4 *)((long)&piVar4[1].Prev + 4) = uStack_5c;
  *(undefined4 *)&piVar4[1].Next = uStack_58;
  *(undefined4 *)((long)&piVar4[1].Next + 4) = uStack_54;
  piVar4[2].Prev = piVar6;
  piVar4[2].Next = (ilist_node_base<false> *)&piVar4[3].Next;
  std::__cxx11::string::_M_construct<char*>((string *)&piVar4[2].Next,local_38,local_38);
  piVar3 = (this->TokenQueue).List.Sentinel.
           super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
           .super_node_base_type.Prev;
  piVar4->Next = (ilist_node_base<false> *)&(this->TokenQueue).List;
  piVar4->Prev = piVar3;
  piVar3->Next = piVar4;
  (this->TokenQueue).List.Sentinel.
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Prev = piVar4;
  this->Current = this->Current + (long)piVar6;
  return true;
}

Assistant:

bool Scanner::scanStreamStart() {
  IsStartOfStream = false;

  EncodingInfo EI = getUnicodeEncoding(currentInput());

  Token T;
  T.Kind = Token::TK_StreamStart;
  T.Range = StringRef(Current, EI.second);
  TokenQueue.push_back(T);
  Current += EI.second;
  return true;
}